

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprism.cpp
# Opt level: O0

int pztopology::TPZPrism::SideNodeLocId(int side,int node)

{
  ostream *poVar1;
  void *this;
  int in_ESI;
  int in_EDI;
  int local_4;
  
  if ((5 < in_EDI) || (local_4 = in_EDI, in_ESI != 0)) {
    if ((in_EDI < 6) || ((0xe < in_EDI || (1 < in_ESI)))) {
      if (in_EDI == 0xf) {
        if (in_ESI < 3) {
          return FaceNodes[0][in_ESI];
        }
        if (in_ESI == 3) {
          return -1;
        }
      }
      if (((in_EDI < 0x10) || (0x12 < in_EDI)) || (3 < in_ESI)) {
        if (in_EDI == 0x13) {
          if (in_ESI < 3) {
            return FaceNodes[4][in_ESI];
          }
          if (in_ESI == 3) {
            return -1;
          }
        }
        if ((in_EDI != 0x14) || (local_4 = in_ESI, 5 < in_ESI)) {
          poVar1 = std::operator<<((ostream *)&std::cerr,
                                   "TPZPrism::SideNodeLocId inconsistent side or node ");
          poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
          poVar1 = std::operator<<(poVar1,' ');
          this = (void *)std::ostream::operator<<(poVar1,in_ESI);
          std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
          local_4 = -1;
        }
      }
      else {
        local_4 = FaceNodes[in_EDI + -0xf][in_ESI];
      }
    }
    else {
      local_4 = SideNodes[in_EDI + -6][in_ESI];
    }
  }
  return local_4;
}

Assistant:

int TPZPrism::SideNodeLocId(int side, int node)
	{
		if(side<6 && node == 0) return side;
		if(side>= 6 && side < 15 && node<2) return SideNodes[side-6][node];
		if(side==15) {
			if(node < 3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; //previsto para faces triangulares
		}
		if(side>15 && side <19 && node <4) return FaceNodes[side-15][node];
		if(side==19) {
			if(node<3) return FaceNodes[side-15][node];
			else if(node == 3) return -1; // Previsto p/ faces triangulares
        }
		
		if(side==20 && node<6) return node;
		PZError << "TPZPrism::SideNodeLocId inconsistent side or node " << side << ' ' << node << endl;
		return -1;
	}